

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffmahd(fitsfile *fptr,int hdunum,int *exttype,int *status)

{
  int iVar1;
  int *in_RCX;
  long in_RDX;
  uint in_ESI;
  undefined4 *in_RDI;
  LONGLONG *ptr;
  char message [81];
  int tstatus;
  int moveto;
  int *in_stack_00000128;
  int *in_stack_00000130;
  fitsfile *in_stack_00000138;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  fitsfile *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  if (*in_RCX < 1) {
    if ((int)in_ESI < 1) {
      *in_RCX = 0x12d;
      local_4 = 0x12d;
    }
    else {
      if (*(int *)(*(long *)(in_RDI + 2) + 100) <= (int)in_ESI) {
        in_stack_ffffffffffffff70 =
             (int *)realloc(*(void **)(*(long *)(in_RDI + 2) + 0x68),
                            (long)(int)(in_ESI + 0x3e9) << 3);
        if (in_stack_ffffffffffffff70 == (int *)0x0) {
          *in_RCX = 0x71;
          return 0x71;
        }
        *(uint *)(*(long *)(in_RDI + 2) + 100) = in_ESI + 1000;
        *(int **)(*(long *)(in_RDI + 2) + 0x68) = in_stack_ffffffffffffff70;
      }
      *in_RDI = *(undefined4 *)(*(long *)(in_RDI + 2) + 0x54);
      do {
        if (*(int *)(*(long *)(in_RDI + 2) + 0x54) + 1U == in_ESI) {
          if (in_RDX != 0) {
            ffghdt(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          }
          return *in_RCX;
        }
        if ((int)(in_ESI - 1) < *(int *)(*(long *)(in_RDI + 2) + 0x60) + 1) {
          in_stack_ffffffffffffff6c = in_ESI - 1;
        }
        else {
          in_stack_ffffffffffffff6c = *(int *)(*(long *)(in_RDI + 2) + 0x60) + 1;
        }
        if (*(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)in_stack_ffffffffffffff6c * 8)
            < *(long *)(*(long *)(in_RDI + 2) + 0x30)) {
          iVar1 = ffchdu((fitsfile *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8);
          if ((iVar1 < 1) &&
             (iVar1 = ffgext(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80), 0 < iVar1)) {
            in_stack_ffffffffffffffd0 = 0;
            ffrhdu(in_stack_00000138,in_stack_00000130,in_stack_00000128);
          }
        }
        else {
          *in_RCX = 0x6b;
        }
      } while (*in_RCX < 1);
      if (*in_RCX != 0x6b) {
        snprintf(&stack0xffffffffffffff78,0x51,"Failed to move to HDU number %d (ffmahd).",
                 (ulong)in_ESI);
        ffpmsg((char *)0x1635b8);
      }
      local_4 = *in_RCX;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffmahd(fitsfile *fptr,      /* I - FITS file pointer             */
           int hdunum,          /* I - number of the HDU to move to  */
           int *exttype,        /* O - type of extension, 0, 1, or 2 */
           int *status)         /* IO - error status                 */
/*
  Move to Absolute Header Data unit.  Move to the specified HDU
  and read the header to initialize the table structure.  Note that extnum 
  is one based, so the primary array is extnum = 1.
*/
{
    int moveto, tstatus;
    char message[FLEN_ERRMSG];
    LONGLONG *ptr;

    if (*status > 0)
        return(*status);
    else if (hdunum < 1 )
        return(*status = BAD_HDU_NUM);
    else if (hdunum >= (fptr->Fptr)->MAXHDU )
    {
        /* allocate more space for the headstart array */
        ptr = (LONGLONG*) realloc( (fptr->Fptr)->headstart,
                        (hdunum + 1001) * sizeof(LONGLONG) ); 

        if (ptr == NULL)
           return (*status = MEMORY_ALLOCATION);
        else {
          (fptr->Fptr)->MAXHDU = hdunum + 1000; 
          (fptr->Fptr)->headstart = ptr;
        }
    }

    /* set logical HDU position to the actual position, in case they differ */
    fptr->HDUposition = (fptr->Fptr)->curhdu;

    while( ((fptr->Fptr)->curhdu) + 1 != hdunum) /* at the correct HDU? */
    {
        /* move directly to the extension if we know that it exists,
           otherwise move to the highest known extension.  */
        
        moveto = minvalue(hdunum - 1, ((fptr->Fptr)->maxhdu) + 1);

        /* test if HDU exists */
        if ((fptr->Fptr)->headstart[moveto] < (fptr->Fptr)->logfilesize )
        {
            if (ffchdu(fptr, status) <= 0)  /* close out the current HDU */
            {
                if (ffgext(fptr, moveto, exttype, status) > 0)
                {   /* failed to get the requested extension */

                    tstatus = 0;
                    ffrhdu(fptr, exttype, &tstatus); /* restore the CHDU */
                }
            }
        }
        else
            *status = END_OF_FILE;

        if (*status > 0)
        {
            if (*status != END_OF_FILE)
            {
                /* don't clutter up the message stack in the common case of */
                /* simply hitting the end of file (often an expected error) */

                snprintf(message,FLEN_ERRMSG,
                "Failed to move to HDU number %d (ffmahd).", hdunum);
                ffpmsg(message);
            }
            return(*status);
        }
    }

    /* return the type of HDU; tile compressed images which are stored */
    /* in a binary table will return exttype = IMAGE_HDU, not BINARY_TBL */
    if (exttype != NULL)
        ffghdt(fptr, exttype, status);

    return(*status);
}